

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall Clasp::Solver::inDegree(Solver *this,WeightLitVec *out)

{
  uint uVar1;
  Literal p;
  uint uVar2;
  uint uVar3;
  long lVar4;
  size_type sVar5;
  uint local_5c;
  LitVec temp;
  pair<Clasp::Literal,_int> local_48;
  WeightLitVec *local_40;
  Antecedent xAnte;
  
  if ((this->levels_).super_type.ebo_.size == 0) {
    local_5c = 1;
  }
  else {
    local_40 = out;
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    reserve(out,((this->assign_).trail.ebo_.size -
                (*(uint *)(this->levels_).super_type.ebo_.buf & 0x3fffffff)) / 10);
    sVar5 = (this->assign_).trail.ebo_.size;
    uVar1 = *(uint *)(this->levels_).super_type.ebo_.buf;
    temp.ebo_.buf = (pointer)0x0;
    temp.ebo_.size = 0;
    temp.ebo_.cap = 0;
    local_5c = 1;
    while (sVar5 != (uVar1 & 0x3fffffff)) {
      sVar5 = sVar5 - 1;
      p.rep_ = (this->assign_).trail.ebo_.buf[sVar5].rep_;
      uVar2 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
      xAnte.data_ = (this->assign_).reason_.super_type.ebo_.buf[p.rep_ >> 2].data_;
      if (((uint)xAnte.data_ & 3) != 2 && xAnte.data_ != 0) {
        Antecedent::reason(&xAnte,this,p,&temp);
        uVar3 = 0;
        for (lVar4 = 0; (temp.ebo_._8_8_ & 0xffffffff) << 2 != lVar4; lVar4 = lVar4 + 4) {
          uVar3 = (uVar3 + 1) -
                  (uint)((*(uint *)((long)(this->assign_).assign_.ebo_.buf +
                                   (ulong)(*(uint *)((long)&(temp.ebo_.buf)->rep_ + lVar4) &
                                          0xfffffffc)) ^ uVar2) < 0x10);
        }
        if ((uVar3 != 0) &&
           (local_48.first.rep_ = p.rep_, local_48.second = uVar3,
           bk_lib::
           pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
           ::push_back(local_40,&local_48), local_5c < uVar3)) {
          local_5c = uVar3;
        }
        temp.ebo_._8_8_ = temp.ebo_._8_8_ & 0xffffffff00000000;
      }
    }
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&temp.ebo_);
  }
  return local_5c;
}

Assistant:

uint32 Solver::inDegree(WeightLitVec& out) {
	if (decisionLevel() == 0) { return 1; }
	assert(!hasConflict());
	out.reserve((numAssignedVars()-levelStart(1))/10);
	uint32 maxIn = 1;
	uint32 i = sizeVec(assign_.trail), stop = levelStart(1);
	for (LitVec temp; i-- != stop; ) {
		Literal x    = assign_.trail[i];
		uint32  xLev = assign_.level(x.var());
		uint32  xIn  = 0;
		Antecedent xAnte = assign_.reason(x.var());
		if (!xAnte.isNull() && xAnte.type() != Antecedent::Binary) {
			xAnte.reason(*this, x, temp);
			for (LitVec::const_iterator it = temp.begin(); it != temp.end(); ++it) {
				xIn += level(it->var()) != xLev;
			}
			if (xIn) {
				out.push_back(WeightLiteral(x, xIn));
				maxIn = std::max(xIn, maxIn);
			}
			temp.clear();
		}
	}
	return maxIn;
}